

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O2

void __thiscall Downloader::Uninstall(Downloader *this,string *package)

{
  bool bVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  string sStack_3f8;
  PackageList packagelist;
  string local_3a8;
  string local_388;
  string compiler;
  DownloadPackage inpack;
  CCDir ccdir;
  CCDir local_1d8;
  CCDir local_f8;
  
  get_compiler_abi_cxx11_(&compiler,this,true);
  std::__cxx11::string::string((string *)&local_388,(string *)&compiler);
  MakeCCDir(&ccdir,this,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::string((string *)&local_3a8,(string *)package);
  LibParse(&inpack,this,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_header;
  packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       packagelist.packages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  CCDir::CCDir(&local_f8,&ccdir);
  PackageList::read(&packagelist,(int)&local_f8,__buf,in_RCX);
  CCDir::~CCDir(&local_f8);
  std::__cxx11::string::string((string *)&sStack_3f8,(string *)&inpack);
  bVar1 = PackageList::erase(&packagelist,&sStack_3f8);
  std::__cxx11::string::~string((string *)&sStack_3f8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Successfully uninstalled ");
    poVar2 = std::operator<<(poVar2,(string *)&inpack);
  }
  else {
    poVar2 = operator<<((ostream *)&std::cout,ispring::xout[0x36]);
    poVar2 = std::operator<<(poVar2,"WARNING: Skipping ");
    poVar2 = std::operator<<(poVar2,(string *)&inpack);
    poVar2 = std::operator<<(poVar2," as it is not installed.");
    poVar2 = operator<<(poVar2,ispring::xout[0x37]);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  CCDir::CCDir(&local_1d8,&ccdir);
  PackageList::write(&packagelist,(int)&local_1d8,__buf_00,in_RCX);
  CCDir::~CCDir(&local_1d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
               *)&packagelist);
  DownloadPackage::~DownloadPackage(&inpack);
  CCDir::~CCDir(&ccdir);
  std::__cxx11::string::~string((string *)&compiler);
  return;
}

Assistant:

void Uninstall(std::string package){
        std::string compiler=get_compiler();
        CCDir ccdir=MakeCCDir(compiler);
        DownloadPackage inpack=LibParse(package);
        PackageList packagelist;
        packagelist.read(ccdir);
        if(packagelist.erase(inpack.libname)){
            std::cout << "Successfully uninstalled " << inpack.libname << std::endl;
        }else{
            std::cout << ispring::xout.yellow << "WARNING: Skipping " << inpack.libname << " as it is not installed." << ispring::xout.white << std::endl;
        }
        packagelist.write(ccdir);
    }